

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_error.h
# Opt level: O3

void __thiscall cppcms::cppcms_error::~cppcms_error(cppcms_error *this)

{
  void *pvVar1;
  runtime_error *this_00;
  
  *(undefined ***)&this->super_runtime_error = &PTR__backtrace_00108bf8;
  pvVar1 = *(void **)&(this->super_runtime_error).field_0x8;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  this_00 = (runtime_error *)
            &this[-1].super_runtime_error.super_backtrace.frames_.
             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  std::runtime_error::~runtime_error(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

class CPPCMS_API cppcms_error : public booster::runtime_error {
	std::string strerror(int err);
public:
	///
	/// Create an object with error code err (errno) and a message \a error
	///
	cppcms_error(int err,std::string const &error);
	///
	/// Create an object with message \a error
	///
	cppcms_error(std::string const &error) : booster::runtime_error(error) {};
}